

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O1

void __thiscall wabt::ExportModuleField::ExportModuleField(ExportModuleField *this,Location *loc)

{
  size_type sVar1;
  size_t sVar2;
  undefined8 uVar3;
  Location local_48;
  
  (this->super_ModuleFieldMixin<(wabt::ModuleFieldType)3>).super_ModuleField.
  super_intrusive_list_base<wabt::ModuleField>.next_ = (ModuleField *)0x0;
  (this->super_ModuleFieldMixin<(wabt::ModuleFieldType)3>).super_ModuleField.
  super_intrusive_list_base<wabt::ModuleField>.prev_ = (ModuleField *)0x0;
  (this->super_ModuleFieldMixin<(wabt::ModuleFieldType)3>).super_ModuleField._vptr_ModuleField =
       (_func_int **)&PTR__ModuleField_0155b078;
  sVar1 = (loc->filename).size_;
  sVar2 = (loc->field_1).field_1.offset;
  uVar3 = *(undefined8 *)((long)&loc->field_1 + 8);
  (this->super_ModuleFieldMixin<(wabt::ModuleFieldType)3>).super_ModuleField.loc.filename.data_ =
       (loc->filename).data_;
  (this->super_ModuleFieldMixin<(wabt::ModuleFieldType)3>).super_ModuleField.loc.filename.size_ =
       sVar1;
  (this->super_ModuleFieldMixin<(wabt::ModuleFieldType)3>).super_ModuleField.loc.field_1.field_1.
  offset = sVar2;
  *(undefined8 *)
   ((long)&(this->super_ModuleFieldMixin<(wabt::ModuleFieldType)3>).super_ModuleField.loc.field_1 +
   8) = uVar3;
  (this->super_ModuleFieldMixin<(wabt::ModuleFieldType)3>).super_ModuleField.type_ = Export;
  (this->super_ModuleFieldMixin<(wabt::ModuleFieldType)3>).super_ModuleField._vptr_ModuleField =
       (_func_int **)&PTR__ExportModuleField_0155b3e8;
  (this->export_).name._M_dataplus._M_p = (pointer)&(this->export_).name.field_2;
  (this->export_).name._M_string_length = 0;
  (this->export_).name.field_2._M_local_buf[0] = '\0';
  local_48.field_1.field_0.line = 0;
  local_48.field_1._4_8_ = 0;
  local_48.filename.data_ = (char *)0x0;
  local_48.filename.size_._0_4_ = 0;
  local_48.filename.size_._4_4_ = 0;
  Var::Var(&(this->export_).var,0xffffffff,&local_48);
  return;
}

Assistant:

explicit ExportModuleField(const Location& loc = Location())
      : ModuleFieldMixin<ModuleFieldType::Export>(loc) {}